

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

void Emb_ManPlacementRefine(Emb_Man_t *p,int nIters,int fVerbose)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  unsigned_short *puVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  void *__ptr;
  void *__ptr_00;
  float *pArray;
  float *pArray_00;
  ulong uVar9;
  int *piVar10;
  int *__ptr_01;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  unsigned_short uVar14;
  int level;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  size_t __size;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  timespec ts;
  double local_78;
  long local_58;
  timespec local_50;
  int *local_40;
  int *local_38;
  
  iVar6 = clock_gettime(3,&local_50);
  if (iVar6 < 0) {
    local_58 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_58 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (p->pPlacement != (unsigned_short *)0x0) {
    __size = (long)p->nObjs << 2;
    __ptr = malloc(__size);
    __ptr_00 = malloc(__size);
    pArray = (float *)malloc(__size);
    pArray_00 = (float *)malloc(__size);
    if (0 < nIters) {
      iVar6 = 0;
      do {
        iVar8 = p->nObjData;
        if (iVar8 < 1) {
          local_78 = 0.0;
        }
        else {
          local_38 = p->pObjData;
          local_40 = local_38 + 5;
          uVar7 = 0;
          local_78 = 0.0;
          do {
            if (local_38 == (int *)0x0) {
              local_78 = 0.0;
              break;
            }
            puVar1 = (uint *)(local_38 + uVar7);
            puVar5 = p->pPlacement;
            uVar2 = *puVar1;
            uVar3 = puVar1[4];
            uVar15 = (uint)puVar5[uVar3 * 2];
            uVar18 = (uint)puVar5[(ulong)(uVar3 * 2) + 1];
            uVar4 = puVar1[1];
            uVar16 = uVar15;
            uVar19 = uVar18;
            if (0 < (long)(int)uVar4) {
              lVar11 = 0;
              do {
                uVar13 = (uint)puVar5[puVar1[(long)local_40[(ulong)(uVar2 >> 4) +
                                                            (ulong)uVar7 + lVar11] + 4] * 2];
                if (puVar5[puVar1[(long)local_40[(ulong)(uVar2 >> 4) + (ulong)uVar7 + lVar11] + 4] *
                           2] <= uVar16) {
                  uVar16 = uVar13;
                }
                if (uVar13 < uVar15) {
                  uVar13 = uVar15;
                }
                uVar15 = uVar13;
                uVar13 = (uint)puVar5[(ulong)(puVar1[(long)local_40[(ulong)(uVar2 >> 4) +
                                                                    (ulong)uVar7 + lVar11] + 4] * 2)
                                      + 1];
                if (puVar5[(ulong)(puVar1[(long)local_40[(ulong)(uVar2 >> 4) + (ulong)uVar7 + lVar11
                                                        ] + 4] * 2) + 1] <= uVar19) {
                  uVar19 = uVar13;
                }
                if (uVar13 < uVar18) {
                  uVar13 = uVar18;
                }
                uVar18 = uVar13;
                lVar11 = lVar11 + 1;
              } while ((int)uVar4 != lVar11);
            }
            *(float *)((long)__ptr + (ulong)uVar3 * 4) = (float)(uVar16 + uVar15) * 0.5;
            *(float *)((long)__ptr_00 + (ulong)uVar3 * 4) = (float)(uVar18 + uVar19) * 0.5;
            local_78 = local_78 + (double)(int)((uVar15 - (uVar16 + uVar19)) + uVar18);
            uVar7 = (uVar2 >> 4) + uVar7 + uVar4 + 5;
          } while ((int)uVar7 < iVar8);
          if ((0 < iVar8) && (piVar10 = p->pObjData, piVar10 != (int *)0x0)) {
            uVar12 = 0;
            do {
              puVar1 = (uint *)(piVar10 + uVar12);
              uVar17 = (ulong)puVar1[4];
              fVar21 = *(float *)((long)__ptr + uVar17 * 4);
              fVar20 = *(float *)((long)__ptr_00 + uVar17 * 4);
              uVar7 = *puVar1 >> 4;
              if (0xf < *puVar1) {
                uVar9 = 0;
                do {
                  fVar21 = fVar21 + *(float *)((long)__ptr +
                                              (ulong)puVar1[4 - (long)(int)puVar1[uVar9 + 5]] * 4);
                  fVar20 = fVar20 + *(float *)((long)__ptr_00 +
                                              (ulong)puVar1[4 - (long)(int)puVar1[uVar9 + 5]] * 4);
                  uVar9 = uVar9 + 1;
                } while (uVar7 != uVar9);
              }
              pArray[uVar17] = fVar21 / (float)(uVar7 + 1);
              pArray_00[puVar1[4]] = fVar20 / (float)((*puVar1 >> 4) + 1);
              uVar7 = (int)uVar12 + (*puVar1 >> 4) + puVar1[1] + 5;
              uVar12 = (ulong)uVar7;
            } while ((int)uVar7 < iVar8);
          }
        }
        piVar10 = Gia_SortFloats(pArray,(int *)0x0,p->nObjs);
        __ptr_01 = Gia_SortFloats(pArray_00,(int *)0x0,p->nObjs);
        iVar8 = p->nObjs;
        if ((long)iVar8 < 1) {
          if (piVar10 != (int *)0x0) goto LAB_0068e78b;
        }
        else {
          puVar5 = p->pPlacement;
          lVar11 = 0;
          do {
            uVar14 = (unsigned_short)(int)(((double)(int)lVar11 * 32767.0) / (double)iVar8);
            puVar5[(long)piVar10[lVar11] * 2] = uVar14;
            puVar5[(long)__ptr_01[lVar11] * 2 + 1] = uVar14;
            lVar11 = lVar11 + 1;
          } while (iVar8 != lVar11);
LAB_0068e78b:
          free(piVar10);
        }
        if (__ptr_01 != (int *)0x0) {
          free(__ptr_01);
        }
        iVar6 = iVar6 + 1;
        if (fVerbose != 0) {
          iVar8 = 0x929648;
          printf("%2d : HPWL = %e  ",local_78);
          Abc_Print(iVar8,"%s =","Time");
          level = 3;
          iVar8 = clock_gettime(3,&local_50);
          if (iVar8 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
          }
          Abc_Print(level,"%9.2f sec\n",(double)(lVar11 + local_58) / 1000000.0);
        }
      } while (iVar6 != nIters);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
    }
    if (pArray != (float *)0x0) {
      free(pArray);
    }
    if (pArray_00 != (float *)0x0) {
      free(pArray_00);
    }
  }
  return;
}

Assistant:

void Emb_ManPlacementRefine( Emb_Man_t * p, int nIters, int fVerbose )
{
    Emb_Obj_t * pThis, * pNext;
    double CostThis, CostPrev;
    float * pEdgeX, * pEdgeY;
    float * pVertX, * pVertY;
    float VertX, VertY;
    int * pPermX, * pPermY;
    int i, k, Iter, iMinX, iMaxX, iMinY, iMaxY;
    abctime clk = Abc_Clock();
    if ( p->pPlacement == NULL )
        return;
    pEdgeX = ABC_ALLOC( float, p->nObjs );
    pEdgeY = ABC_ALLOC( float, p->nObjs );
    pVertX = ABC_ALLOC( float, p->nObjs );
    pVertY = ABC_ALLOC( float, p->nObjs );
    // refine placement
    CostPrev = 0.0;
    for ( Iter = 0; Iter < nIters; Iter++ )
    {
        // compute centers of hyperedges
        CostThis = 0.0;
        Emb_ManForEachObj( p, pThis, i )
        {
            iMinX = iMaxX = p->pPlacement[2*pThis->Value+0];
            iMinY = iMaxY = p->pPlacement[2*pThis->Value+1];
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                iMinX = Abc_MinInt( iMinX, p->pPlacement[2*pNext->Value+0] );
                iMaxX = Abc_MaxInt( iMaxX, p->pPlacement[2*pNext->Value+0] );
                iMinY = Abc_MinInt( iMinY, p->pPlacement[2*pNext->Value+1] );
                iMaxY = Abc_MaxInt( iMaxY, p->pPlacement[2*pNext->Value+1] );
            }
            pEdgeX[pThis->Value] = 0.5 * (iMaxX + iMinX);
            pEdgeY[pThis->Value] = 0.5 * (iMaxY + iMinY);
            CostThis += (iMaxX - iMinX) + (iMaxY - iMinY);
        }
        // compute new centers of objects
        Emb_ManForEachObj( p, pThis, i )
        {
            VertX = pEdgeX[pThis->Value];
            VertY = pEdgeY[pThis->Value];
            Emb_ObjForEachFanin( pThis, pNext, k )
            {
                VertX += pEdgeX[pNext->Value];
                VertY += pEdgeY[pNext->Value];
            }
            pVertX[pThis->Value] = VertX / (Emb_ObjFaninNum(pThis) + 1);
            pVertY[pThis->Value] = VertY / (Emb_ObjFaninNum(pThis) + 1);
        }
        // sort these numbers
        pPermX = Gia_SortFloats( pVertX, NULL, p->nObjs );
        pPermY = Gia_SortFloats( pVertY, NULL, p->nObjs );
        for ( k = 0; k < p->nObjs; k++ )
        {
            p->pPlacement[2*pPermX[k]+0] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
            p->pPlacement[2*pPermY[k]+1] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
        }
        ABC_FREE( pPermX );
        ABC_FREE( pPermY );
        // evaluate cost
        if ( fVerbose )
        {
        printf( "%2d : HPWL = %e  ", Iter+1, CostThis );
        ABC_PRT( "Time", Abc_Clock() - clk );
        }
    }
    ABC_FREE( pEdgeX );
    ABC_FREE( pEdgeY );
    ABC_FREE( pVertX );
    ABC_FREE( pVertY );
}